

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O3

timeval * zt_diff_time(timeval *dt,timeval *t1,timeval *t2)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = t2->tv_sec - t1->tv_sec;
  dt->tv_sec = lVar4;
  lVar1 = t2->tv_usec;
  lVar2 = t1->tv_usec;
  uVar5 = lVar1 - lVar2;
  dt->tv_usec = uVar5;
  if ((long)uVar5 < 0) {
    uVar3 = 0xfffffffffff0bdc0;
    if (0xfffffffffff0bdc0 < uVar5) {
      uVar3 = uVar5;
    }
    uVar5 = (ulong)(uVar3 + lVar2 != lVar1);
    uVar5 = (((uVar3 + lVar2) - lVar1) - uVar5) / 1000000 + uVar5;
    dt->tv_usec = ((uVar5 * 1000000 + lVar1) - lVar2) + 1000000;
    dt->tv_sec = lVar4 + ~uVar5;
  }
  return dt;
}

Assistant:

struct timeval *
zt_diff_time(struct timeval *dt, struct timeval *t1, struct timeval *t2)
{
    dt->tv_sec = t2->tv_sec - t1->tv_sec;
    dt->tv_usec = t2->tv_usec - t1->tv_usec;

    while (dt->tv_usec < 0) {
        dt->tv_usec += 1000000;
        dt->tv_sec -= 1;
    }
    return dt;
}